

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::
Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
Animatable(Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
           *this,vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v)

{
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v_local;
  Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  *this_local;
  
  memset(this,0,0x18);
  ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
            (&this->_value);
  this->_has_value = false;
  this->_blocked = false;
  TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
  ::TypedTimeSamples(&this->_ts);
  set(this,v);
  return;
}

Assistant:

Animatable(const T &v) {
    set(v);
  }